

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

int GENERAL_NAME_set0_othername(GENERAL_NAME *gen,ASN1_OBJECT *oid,ASN1_TYPE *value)

{
  OTHERNAME *value_00;
  OTHERNAME *oth;
  ASN1_TYPE *value_local;
  ASN1_OBJECT *oid_local;
  GENERAL_NAME *gen_local;
  
  value_00 = OTHERNAME_new();
  if (value_00 != (OTHERNAME *)0x0) {
    ASN1_TYPE_free(value_00->value);
    value_00->type_id = oid;
    value_00->value = value;
    GENERAL_NAME_set0_value(gen,0,value_00);
  }
  gen_local._4_4_ = (uint)(value_00 != (OTHERNAME *)0x0);
  return gen_local._4_4_;
}

Assistant:

int GENERAL_NAME_set0_othername(GENERAL_NAME *gen, ASN1_OBJECT *oid,
                                ASN1_TYPE *value) {
  OTHERNAME *oth;
  oth = OTHERNAME_new();
  if (!oth) {
    return 0;
  }
  ASN1_TYPE_free(oth->value);
  oth->type_id = oid;
  oth->value = value;
  GENERAL_NAME_set0_value(gen, GEN_OTHERNAME, oth);
  return 1;
}